

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

void __thiscall Util::BlockShuffle(Util *this,array<int,_9UL> *vec)

{
  int i;
  long lVar1;
  undefined1 auVar2 [16];
  array<int,_3UL> block;
  array<int,_3UL> blocks;
  undefined8 local_50;
  undefined4 uStack_48;
  int iStack_44;
  int local_40 [4];
  undefined1 auVar3 [16];
  
  local_40[0] = 0;
  local_40[1] = 1;
  local_40[2] = 2;
  std::
  shuffle<int*,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
            (local_40,local_40 + 3,&this->rng_);
  lVar1 = 0;
  do {
    local_50 = 0x100000000;
    uStack_48 = 2;
    std::
    shuffle<int*,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
              ((int *)&local_50,&iStack_44,&this->rng_);
    lVar1 = lVar1 + 1;
    auVar2._8_4_ = uStack_48;
    auVar2._0_8_ = local_50;
    auVar2._12_4_ = iStack_44;
    auVar2 = vmovdqu32_avx512vl(auVar2);
    auVar3._0_12_ = auVar2._0_12_;
    auVar3._12_4_ = 0;
    auVar2 = vpbroadcastd_avx512vl();
    auVar2 = vpaddd_avx(auVar2,auVar3);
    auVar2 = vmovdqu32_avx512vl(auVar2);
    *(undefined1 (*) [16])vec = auVar2;
    vec = (array<int,_9UL> *)((long)vec + 0xc);
  } while (lVar1 != 3);
  return;
}

Assistant:

void Util::BlockShuffle(array<int, 9> *vec) {
    array<int, 3> blocks{0, 1, 2};
    shuffle(blocks.begin(), blocks.end(), rng_);
    for (int i = 0; i < 3; i++) {
        array<int, 3> block{0, 1, 2};
        shuffle(block.begin(), block.end(), rng_);
        for (int j = 0; j < 3; j++) {
            (*vec)[i * 3 + j] = blocks[i] * 3 + block[j];
        }
    }
}